

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlParserCtxtPtrWrap(xmlParserCtxtPtr ctxt)

{
  PyObject *ret;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ctxt_local = (xmlParserCtxtPtr)&_Py_NoneStruct;
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)PyCapsule_New(ctxt,"xmlParserCtxtPtr",0);
  }
  return (PyObject *)ctxt_local;
}

Assistant:

PyObject *
libxml_xmlParserCtxtPtrWrap(xmlParserCtxtPtr ctxt)
{
    PyObject *ret;

    if (ctxt == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }

    ret = PyCapsule_New((void *) ctxt, (char *) "xmlParserCtxtPtr", NULL);
    return (ret);
}